

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.hpp
# Opt level: O2

LogicalCTERef * __thiscall
duckdb::LogicalOperator::Cast<duckdb::LogicalCTERef>(LogicalOperator *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->type == LOGICAL_CTE_REF) {
    return (LogicalCTERef *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "Failed to cast logical operator to type - logical operator type mismatch",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (TARGET::TYPE != LogicalOperatorType::LOGICAL_INVALID && type != TARGET::TYPE) {
			throw InternalException("Failed to cast logical operator to type - logical operator type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}